

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O3

uint __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::CheckDisposedObjectFreeBitVector
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  FreeObject *this_00;
  uint bitIndex;
  uint uVar5;
  
  this_00 = this->disposedObjectList;
  if (this_00 == (FreeObject *)0x0) {
    return 0;
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar5 = 1;
  do {
    if (((ulong)this_00 & 0xf) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                         "HeapInfo::IsAlignedAddress(objectAddress)");
      if (!bVar2) goto LAB_0073014c;
      *puVar4 = 0;
    }
    bitIndex = (uint)((ulong)this_00 >> 4) & 0xff;
    bVar2 = SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidBitIndex
                      ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,bitIndex);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x279,"(this->IsValidBitIndex(bitIndex))",
                         "this->IsValidBitIndex(bitIndex)");
      if (!bVar2) goto LAB_0073014c;
      *puVar4 = 0;
    }
    BVar3 = BVStatic<256UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.debugFreeBits,bitIndex
                      );
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27a,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "!this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar2) goto LAB_0073014c;
      *puVar4 = 0;
    }
    BVar3 = BVStatic<256UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.freeBits,bitIndex);
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27b,"(free->Test(bitIndex))","free->Test(bitIndex)");
      if (!bVar2) {
LAB_0073014c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (this_00 == this->disposedObjectListTail) {
      return uVar5;
    }
    this_00 = FreeObject::GetNext(this_00);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

uint
SmallFinalizableHeapBlockT<TBlockAttributes>::CheckDisposedObjectFreeBitVector()
{
    uint verifyFreeCount = 0;
    // all the finalized object are considered freed, but not allocable yet
    FreeObject *freeObject = this->disposedObjectList;
    if (freeObject != nullptr)
    {
        SmallHeapBlockBitVector * free = this->GetFreeBitVector();
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return verifyFreeCount;
}